

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::setActiveSubWindow(QMdiArea *this,QMdiSubWindow *window)

{
  QMdiAreaPrivate *this_00;
  qsizetype qVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  QMdiSubWindow *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_18 = window;
  if (window == (QMdiSubWindow *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QMdiAreaPrivate::activateWindow(this_00,(QMdiSubWindow *)0x0);
      return;
    }
    goto LAB_0040e2e2;
  }
  if ((this_00->childWindows).d.size == 0) {
    pcVar2 = "QMdiArea::setActiveSubWindow: workspace is empty";
LAB_0040e2d6:
    local_20 = "default";
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    QMessageLogger::warning(local_38,pcVar2);
  }
  else {
    qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                      (&this_00->childWindows,&local_18,0);
    if (qVar1 == -1) {
      pcVar2 = "QMdiArea::setActiveSubWindow: window is not inside workspace";
      goto LAB_0040e2d6;
    }
    QMdiAreaPrivate::activateWindow(this_00,local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0040e2e2:
  __stack_chk_fail();
}

Assistant:

void QMdiArea::setActiveSubWindow(QMdiSubWindow *window)
{
    Q_D(QMdiArea);
    if (!window) {
        d->activateWindow(nullptr);
        return;
    }

    if (Q_UNLIKELY(d->childWindows.isEmpty())) {
        qWarning("QMdiArea::setActiveSubWindow: workspace is empty");
        return;
    }

    if (Q_UNLIKELY(d->childWindows.indexOf(window) == -1)) {
        qWarning("QMdiArea::setActiveSubWindow: window is not inside workspace");
        return;
    }

    d->activateWindow(window);
}